

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_GeometryShop.H
# Opt level: O0

int __thiscall
amrex::EB2::GeometryShop<amrex::EB2::TorusIF,_int>::getBoxType_Cpu
          (GeometryShop<amrex::EB2::TorusIF,_int> *this,Box *bx,Geometry *geom)

{
  CoordSys *in_RDX;
  Box *in_RSI;
  literals *in_RDI;
  literals *this_00;
  TorusIF *pTVar1;
  Real RVar2;
  GpuArray<int,_3U> GVar3;
  Real v;
  RealArray xyz;
  int i;
  int j;
  int k;
  int nfluid;
  int nzero;
  int nbody;
  int *blo;
  GpuArray<int,_3U> *len3;
  Real *dx;
  Real *problo;
  TorusIF *in_stack_ffffffffffffff28;
  TorusIF *in_stack_ffffffffffffff30;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_8c;
  undefined8 local_80;
  int local_78;
  undefined8 local_6c;
  int local_64;
  int *local_60;
  Real *local_58;
  Real *local_50;
  CoordSys *local_48;
  Box *local_40;
  int local_30;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_48 = in_RDX;
  local_40 = in_RSI;
  local_50 = Geometry::ProbLo((Geometry *)0x147e9e9);
  local_58 = CoordSys::CellSize(local_48);
  GVar3 = Box::length3d(local_40);
  local_80 = GVar3.arr._0_8_;
  local_6c = local_80;
  local_78 = GVar3.arr[2];
  local_64 = local_78;
  local_60 = (int *)&local_6c;
  Box::loVect(local_40);
  local_8c = 0;
  local_94 = 0;
  local_98 = 0;
  do {
    local_8 = local_60;
    local_c = 2;
    if (local_60[2] <= local_98) {
      if (local_8c == 0) {
        local_30 = -1;
      }
      else if (local_94 == 0) {
        local_30 = 1;
      }
      else {
        local_30 = 0;
      }
      return local_30;
    }
    local_9c = 0;
    while( true ) {
      local_18 = local_60;
      local_1c = 1;
      if (local_60[1] <= local_9c) break;
      local_a0 = 0;
      while( true ) {
        local_28 = local_60;
        local_2c = 0;
        if (*local_60 <= local_a0) break;
        this_00 = in_RDI;
        pTVar1 = (TorusIF *)
                 TorusIF::operator()(in_stack_ffffffffffffff30,
                                     (RealArray *)in_stack_ffffffffffffff28);
        in_stack_ffffffffffffff30 = pTVar1;
        RVar2 = literals::operator____rt(this_00,(longdouble)0);
        if (((double)in_stack_ffffffffffffff30 != RVar2) ||
           (NAN((double)in_stack_ffffffffffffff30) || NAN(RVar2))) {
          RVar2 = literals::operator____rt(this_00,(longdouble)0);
          in_stack_ffffffffffffff28 = pTVar1;
          if ((double)pTVar1 <= RVar2) {
            local_94 = local_94 + 1;
          }
          else {
            local_8c = local_8c + 1;
          }
        }
        if ((0 < local_8c) && (0 < local_94)) {
          return 0;
        }
        local_a0 = local_a0 + 1;
      }
      local_9c = local_9c + 1;
    }
    local_98 = local_98 + 1;
  } while( true );
}

Assistant:

int getBoxType_Cpu (const Box& bx, Geometry const& geom) const noexcept
    {
        const Real* problo = geom.ProbLo();
        const Real* dx = geom.CellSize();
        const auto& len3 = bx.length3d();
        const int* blo = bx.loVect();
        int nbody = 0, nzero = 0, nfluid = 0;
        for         (int k = 0; k < len3[2]; ++k) {
            for     (int j = 0; j < len3[1]; ++j) {
                for (int i = 0; i < len3[0]; ++i) {
                    RealArray xyz {AMREX_D_DECL(problo[0]+(i+blo[0])*dx[0],
                                                problo[1]+(j+blo[1])*dx[1],
                                                problo[2]+(k+blo[2])*dx[2])};
                    Real v = m_f(xyz);
                    if (v == 0.0_rt) {
                        ++nzero;
                    } else if (v > 0.0_rt) {
                        ++nbody;
                    } else {
                        ++nfluid;
                    }
                    if (nbody > 0 && nfluid > 0) return mixedcells;
                }
            }
        }

        if (nbody == 0) {
            return allregular;
        } else if (nfluid == 0) {
            return allcovered;
        } else {
            return mixedcells;
        }
    }